

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O2

int pztopology::TPZPrism::SideNodeLocId(int side,int node)

{
  ostream *poVar1;
  
  if (5 < side || node != 0) {
    if (node < 2 && side - 6U < 9) {
      side = SideNodes[side - 6U][node];
    }
    else {
      if (side == 0xf) {
        if (node < 3) {
          return FaceNodes[0][node];
        }
        if (node == 3) {
          return -1;
        }
      }
      if (node < 4 && side - 0x10U < 3) {
        side = FaceNodes[side - 0xf][node];
      }
      else {
        if (side == 0x13) {
          if (node < 3) {
            return FaceNodes[4][node];
          }
          if (node == 3) {
            return -1;
          }
        }
        else if (side == 0x14 && node < 6) {
          return node;
        }
        poVar1 = std::operator<<((ostream *)&std::cerr,
                                 "TPZPrism::SideNodeLocId inconsistent side or node ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,side);
        poVar1 = std::operator<<(poVar1,' ');
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,node);
        std::endl<char,std::char_traits<char>>(poVar1);
        side = -1;
      }
    }
  }
  return side;
}

Assistant:

int TPZPrism::SideNodeLocId(int side, int node)
	{
		if(side<6 && node == 0) return side;
		if(side>= 6 && side < 15 && node<2) return SideNodes[side-6][node];
		if(side==15) {
			if(node < 3) return FaceNodes[side-15][node];
			else if(node == 3) return -1; //previsto para faces triangulares
		}
		if(side>15 && side <19 && node <4) return FaceNodes[side-15][node];
		if(side==19) {
			if(node<3) return FaceNodes[side-15][node];
			else if(node == 3) return -1; // Previsto p/ faces triangulares
        }
		
		if(side==20 && node<6) return node;
		PZError << "TPZPrism::SideNodeLocId inconsistent side or node " << side << ' ' << node << endl;
		return -1;
	}